

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cpp
# Opt level: O1

void __thiscall CFlag::Snap(CFlag *this,int SnappingClient)

{
  float fVar1;
  IServer *pIVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  undefined4 extraout_var;
  
  iVar3 = CEntity::NetworkClipped(&this->super_CEntity,SnappingClient);
  if (iVar3 == 0) {
    pIVar2 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
    iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])
                      (pIVar2,5,(ulong)(uint)this->m_Team,0xc);
    piVar4 = (int *)CONCAT44(extraout_var,iVar3);
    if (piVar4 != (int *)0x0) {
      fVar1 = (this->super_CEntity).m_Pos.field_0.x;
      uVar5 = -(uint)(0.0 < fVar1);
      *piVar4 = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + fVar1);
      fVar1 = (this->super_CEntity).m_Pos.field_1.y;
      uVar5 = -(uint)(0.0 < fVar1);
      piVar4[1] = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + fVar1);
      piVar4[2] = this->m_Team;
    }
  }
  return;
}

Assistant:

void CFlag::Snap(int SnappingClient)
{
	if(NetworkClipped(SnappingClient))
		return;

	CNetObj_Flag *pFlag = (CNetObj_Flag *)Server()->SnapNewItem(NETOBJTYPE_FLAG, m_Team, sizeof(CNetObj_Flag));
	if(!pFlag)
		return;

	pFlag->m_X = round_to_int(m_Pos.x);
	pFlag->m_Y = round_to_int(m_Pos.y);
	pFlag->m_Team = m_Team;
}